

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void __thiscall sznet::net::Connector::handleError(Connector *this)

{
  sz_sock sockfd;
  int v;
  LogStream *this_00;
  char **ppcVar1;
  char *pcVar2;
  SourceFile file;
  SourceFile file_00;
  Logger local_ff8;
  
  file._8_8_ = 0xd;
  file.m_data = "Connector.cpp";
  Logger::Logger(&local_ff8,file,0xcc,ERROR);
  if (0x1d < (uint)(((int)&local_ff8 + 0xfb0) - (int)local_ff8.m_impl.m_stream.m_buffer.m_cur)) {
    builtin_strncpy(local_ff8.m_impl.m_stream.m_buffer.m_cur,"Connector::handleError state=",0x1d);
    local_ff8.m_impl.m_stream.m_buffer.m_cur = local_ff8.m_impl.m_stream.m_buffer.m_cur + 0x1d;
  }
  LogStream::operator<<(&local_ff8.m_impl.m_stream,this->m_state);
  Logger::~Logger(&local_ff8);
  if (this->m_state == kConnecting) {
    sockfd = removeAndResetChannel(this);
    v = sockets::sz_sock_geterror(sockfd);
    if (g_logLevel < 1) {
      file_00._8_8_ = 0xd;
      file_00.m_data = "Connector.cpp";
      Logger::Logger(&local_ff8,file_00,0xd1,TRACE,"handleError");
      if (0xb < (uint)(((int)&local_ff8 + 0xfb0) - (int)local_ff8.m_impl.m_stream.m_buffer.m_cur)) {
        builtin_strncpy(local_ff8.m_impl.m_stream.m_buffer.m_cur,"SO_ERROR = ",0xb);
        local_ff8.m_impl.m_stream.m_buffer.m_cur = local_ff8.m_impl.m_stream.m_buffer.m_cur + 0xb;
      }
      this_00 = LogStream::operator<<(&local_ff8.m_impl.m_stream,v);
      ppcVar1 = &(this_00->m_buffer).m_cur;
      pcVar2 = (this_00->m_buffer).m_cur;
      if (((int)ppcVar1 - (int)pcVar2 & 0xfffffffeU) != 0) {
        *pcVar2 = ' ';
        *ppcVar1 = *ppcVar1 + 1;
      }
      pcVar2 = sz_strerror_tl(v);
      LogStream::operator<<(this_00,pcVar2);
      Logger::~Logger(&local_ff8);
    }
    retry(this,sockfd);
  }
  return;
}

Assistant:

void Connector::handleError()
{
	LOG_ERROR << "Connector::handleError state=" << m_state;
	if (m_state == kConnecting)
	{
		sockets::sz_sock sockfd = removeAndResetChannel();
		int err = sockets::sz_sock_geterror(sockfd);
		LOG_TRACE << "SO_ERROR = " << err << " " << sz_strerror_tl(err);
		retry(sockfd);
	}
}